

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::
setHessianBlockAndItsTranspose
          (MultipleShootingTranscription *this,MatrixDynSize *hessian,MatrixDynSize *block,
          size_t startRow,size_t startCol)

{
  bool *pbVar1;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
  *this_00;
  unsigned_long blockCols;
  ulong in_RCX;
  unsigned_long in_RDI;
  MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_R8;
  DenseBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffe38;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe48;
  MatrixDynSize *in_stack_fffffffffffffe68;
  Index in_stack_fffffffffffffe78;
  Index in_stack_fffffffffffffe80;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  HessianBlocksMap *in_stack_fffffffffffffeb0;
  size_t in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  MatrixDynSize *in_stack_ffffffffffffffa0;
  MatrixDynSize *in_stack_ffffffffffffffa8;
  MultipleShootingTranscription *in_stack_ffffffffffffffb0;
  
  setHessianBlock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                  in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  pbVar1 = HessianBlocksMap::operator()
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0)
  ;
  if ((*pbVar1 & 1U) == 0) {
    toEigen(in_stack_fffffffffffffe68);
    Eigen::
    DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::transpose(in_stack_fffffffffffffe48);
    toEigen(in_stack_fffffffffffffe68);
    iDynTree::MatrixDynSize::cols();
    iDynTree::MatrixDynSize::rows();
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_RDI,
               (unsigned_long)in_stack_fffffffffffffe68);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>::
    operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
               *)in_R8,in_stack_fffffffffffffe38);
    pbVar1 = HessianBlocksMap::operator()
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffea0);
    *pbVar1 = true;
  }
  else {
    toEigen(in_stack_fffffffffffffe68);
    Eigen::
    DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::transpose(in_stack_fffffffffffffe48);
    toEigen(in_stack_fffffffffffffe68);
    this_00 = (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
               *)(in_RCX & 0xffffffff);
    blockCols = iDynTree::MatrixDynSize::cols();
    iDynTree::MatrixDynSize::rows();
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_RDI,
               blockCols);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>>
    ::operator+=(this_00,in_R8);
  }
  return;
}

Assistant:

void setHessianBlockAndItsTranspose(MatrixDynSize& hessian, const MatrixDynSize& block, size_t startRow, size_t startCol) {
                setHessianBlock(hessian, block, startRow, startCol);

                if (m_hessianBlocks(startCol, startRow)) {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startCol), static_cast<unsigned int>(startRow), block.cols(), block.rows()) += toEigen(block).transpose();
                } else {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startCol), static_cast<unsigned int>(startRow), block.cols(), block.rows()) = toEigen(block).transpose();
                    m_hessianBlocks(startCol, startRow) = true;
                }
            }